

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::Object::Object
          (Object *this,char *type,SharedPtr<tcu::ThreadUtil::Event> *e,
          SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<tcu::ThreadUtil::Event> local_20;
  
  local_20.m_ptr = e->m_ptr;
  local_20.m_state = e->m_state;
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_20.m_state)->strongRefCount = (local_20.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_20.m_state)->weakRefCount = (local_20.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::Object::Object(&this->super_Object,type,&local_20);
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_20.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_20.m_ptr = (Event *)0x0;
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_20.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_20.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_02153c40;
  (this->m_modifySync).m_ptr = sync->m_ptr;
  pSVar2 = sync->m_state;
  (this->m_modifySync).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_modifySync).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_readSyncs).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_readSyncs).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_readSyncs).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Object::Object (const char* type, SharedPtr<tcu::ThreadUtil::Event> e, SharedPtr<FenceSync> sync)
	: tcu::ThreadUtil::Object	(type, e)
	, m_modifySync				(sync)
{
}